

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.c
# Opt level: O0

BrotliDecoderErrorCode
CopyUncompressedBlockToOutput
          (size_t *available_out,uint8_t **next_out,size_t *total_out,BrotliDecoderStateInternal *s)

{
  int iVar1;
  BrotliDecoderErrorCode BVar2;
  int local_7c;
  BrotliDecoderErrorCode result;
  int nbytes;
  BrotliDecoderStateInternal *s_local;
  size_t *total_out_local;
  uint8_t **next_out_local;
  size_t *available_out_local;
  size_t local_40;
  uint8_t *local_30;
  
  iVar1 = BrotliEnsureRingBuffer(s);
  if (iVar1 == 0) {
    return BROTLI_DECODER_ERROR_ALLOC_RING_BUFFER_1;
  }
LAB_001b5987:
  if (s->substate_uncompressed != BROTLI_STATE_UNCOMPRESSED_NONE) goto LAB_001b599a;
  local_7c = (int)(s->br).avail_in + (0x40 - (s->br).bit_pos_ >> 3);
  if (s->meta_block_remaining_len < local_7c) {
    local_7c = s->meta_block_remaining_len;
  }
  if (s->ringbuffer_size < s->pos + local_7c) {
    local_7c = s->ringbuffer_size - s->pos;
  }
  local_30 = s->ringbuffer + s->pos;
  for (local_40 = (size_t)local_7c; 7 < 0x40 - (s->br).bit_pos_ && local_40 != 0;
      local_40 = local_40 - 1) {
    *local_30 = (uint8_t)((s->br).val_ >> ((byte)(s->br).bit_pos_ & 0x3f));
    (s->br).bit_pos_ = (s->br).bit_pos_ + 8;
    local_30 = local_30 + 1;
  }
  memcpy(local_30,(s->br).next_in,local_40);
  (s->br).avail_in = (s->br).avail_in - local_40;
  (s->br).next_in = (s->br).next_in + local_40;
  s->pos = local_7c + s->pos;
  s->meta_block_remaining_len = s->meta_block_remaining_len - local_7c;
  if (s->pos < 1 << ((byte)s->window_bits & 0x1f)) {
    if (s->meta_block_remaining_len == 0) {
      return BROTLI_DECODER_SUCCESS;
    }
    return BROTLI_DECODER_NEEDS_MORE_INPUT;
  }
  s->substate_uncompressed = BROTLI_STATE_UNCOMPRESSED_WRITE;
  goto LAB_001b5b98;
LAB_001b599a:
  if (s->substate_uncompressed == BROTLI_STATE_UNCOMPRESSED_WRITE) {
LAB_001b5b98:
    BVar2 = WriteRingBuffer(s,available_out,next_out,total_out,0);
    if (BVar2 != BROTLI_DECODER_SUCCESS) {
      return BVar2;
    }
    if (s->ringbuffer_size == 1 << ((byte)s->window_bits & 0x1f)) {
      s->max_distance = s->max_backward_distance;
    }
    s->substate_uncompressed = BROTLI_STATE_UNCOMPRESSED_NONE;
  }
  goto LAB_001b5987;
}

Assistant:

static BrotliDecoderErrorCode BROTLI_NOINLINE CopyUncompressedBlockToOutput(
    size_t* available_out, uint8_t** next_out, size_t* total_out,
    BrotliDecoderState* s) {
  /* TODO: avoid allocation for single uncompressed block. */
  if (!BrotliEnsureRingBuffer(s)) {
    return BROTLI_FAILURE(BROTLI_DECODER_ERROR_ALLOC_RING_BUFFER_1);
  }

  /* State machine */
  for (;;) {
    switch (s->substate_uncompressed) {
      case BROTLI_STATE_UNCOMPRESSED_NONE: {
        int nbytes = (int)BrotliGetRemainingBytes(&s->br);
        if (nbytes > s->meta_block_remaining_len) {
          nbytes = s->meta_block_remaining_len;
        }
        if (s->pos + nbytes > s->ringbuffer_size) {
          nbytes = s->ringbuffer_size - s->pos;
        }
        /* Copy remaining bytes from s->br.buf_ to ring-buffer. */
        BrotliCopyBytes(&s->ringbuffer[s->pos], &s->br, (size_t)nbytes);
        s->pos += nbytes;
        s->meta_block_remaining_len -= nbytes;
        if (s->pos < 1 << s->window_bits) {
          if (s->meta_block_remaining_len == 0) {
            return BROTLI_DECODER_SUCCESS;
          }
          return BROTLI_DECODER_NEEDS_MORE_INPUT;
        }
        s->substate_uncompressed = BROTLI_STATE_UNCOMPRESSED_WRITE;
      }
      /* Fall through. */

      case BROTLI_STATE_UNCOMPRESSED_WRITE: {
        BrotliDecoderErrorCode result;
        result = WriteRingBuffer(
            s, available_out, next_out, total_out, BROTLI_FALSE);
        if (result != BROTLI_DECODER_SUCCESS) {
          return result;
        }
        if (s->ringbuffer_size == 1 << s->window_bits) {
          s->max_distance = s->max_backward_distance;
        }
        s->substate_uncompressed = BROTLI_STATE_UNCOMPRESSED_NONE;
        break;
      }
    }
  }
  BROTLI_DCHECK(0);  /* Unreachable */
}